

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O3

void __thiscall
duckdb::PartialBlock::AddUninitializedRegion(PartialBlock *this,idx_t start,idx_t end)

{
  pointer *ppUVar1;
  iterator __position;
  UninitializedRegion local_10;
  
  __position._M_current =
       (this->uninitialized_regions).
       super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
       super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->uninitialized_regions).
      super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
      super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10.start = start;
    local_10.end = end;
    ::std::vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>::
    _M_realloc_insert<duckdb::UninitializedRegion>
              (&(this->uninitialized_regions).
                super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
               ,__position,&local_10);
  }
  else {
    (__position._M_current)->start = start;
    (__position._M_current)->end = end;
    ppUVar1 = &(this->uninitialized_regions).
               super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
               .
               super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppUVar1 = *ppUVar1 + 1;
  }
  return;
}

Assistant:

void PartialBlock::AddUninitializedRegion(idx_t start, idx_t end) {
	uninitialized_regions.push_back({start, end});
}